

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

bool StringFormatter<int&,char_const(&)[2]>::output_null<char_const*>(ostream *os,char *value)

{
  char *value_local;
  ostream *os_local;
  
  if (value == (char *)0x0) {
    std::operator<<(os,"(null)");
  }
  return value == (char *)0x0;
}

Assistant:

static bool output_null(std::ostream& os, T value)
    {
        if constexpr (std::is_pointer_v<T> || std::is_null_pointer_v<T>) {
            if (value)
                return false;
            os << "(null)";
            return true;
        }
        return false;
    }